

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddLibrary
          (cmMakefile *this,string *lname,TargetType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  bool bVar1;
  cmTarget *this_00;
  allocator<char> local_49;
  string local_48;
  
  if ((INTERFACE_LIBRARY < type) || ((0x9eU >> (type & 0x1f) & 1) == 0)) {
    __assert_fail("type == cmStateEnums::STATIC_LIBRARY || type == cmStateEnums::SHARED_LIBRARY || type == cmStateEnums::MODULE_LIBRARY || type == cmStateEnums::OBJECT_LIBRARY || type == cmStateEnums::INTERFACE_LIBRARY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmMakefile.cxx"
                  ,0x7c7,
                  "cmTarget *cmMakefile::AddLibrary(const std::string &, cmStateEnums::TargetType, const std::vector<std::string> &, bool)"
                 );
  }
  this_00 = AddNewTarget(this,type,lname);
  cmTarget::ClearDependencyInformation(this_00,this);
  if (!excludeFromAll) {
    if (type == INTERFACE_LIBRARY) goto LAB_0019c96c;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
    bVar1 = GetPropertyAsBool(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar1) goto LAB_0019c96c;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
  cmTarget::SetProperty(this_00,&local_48,"TRUE");
  std::__cxx11::string::~string((string *)&local_48);
LAB_0019c96c:
  cmTarget::AddSources(this_00,srcs);
  AddGlobalLinkInformation(this,this_00);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddLibrary(const std::string& lname,
                                 cmStateEnums::TargetType type,
                                 const std::vector<std::string>& srcs,
                                 bool excludeFromAll)
{
  assert(type == cmStateEnums::STATIC_LIBRARY ||
         type == cmStateEnums::SHARED_LIBRARY ||
         type == cmStateEnums::MODULE_LIBRARY ||
         type == cmStateEnums::OBJECT_LIBRARY ||
         type == cmStateEnums::INTERFACE_LIBRARY);

  cmTarget* target = this->AddNewTarget(type, lname);
  // Clear its dependencies. Otherwise, dependencies might persist
  // over changes in CMakeLists.txt, making the information stale and
  // hence useless.
  target->ClearDependencyInformation(*this);
  if (excludeFromAll ||
      (type != cmStateEnums::INTERFACE_LIBRARY &&
       this->GetPropertyAsBool("EXCLUDE_FROM_ALL"))) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}